

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_16_2_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar23 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar72 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  
  lVar11 = (long)dir;
  lVar3 = (long)cdef_directions_padded[lVar11 + 4][0];
  lVar4 = (long)cdef_directions_padded[lVar11 + 4][1];
  lVar8 = (long)cdef_directions_padded[lVar11][0];
  lVar11 = (long)cdef_directions_padded[lVar11][1];
  auVar28._0_2_ = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar5 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar5 = 0;
      }
    }
    if (0 < block_height) {
      auVar28._2_2_ = auVar28._0_2_;
      auVar28._4_2_ = auVar28._0_2_;
      auVar28._6_2_ = auVar28._0_2_;
      auVar28._8_2_ = auVar28._0_2_;
      auVar28._10_2_ = auVar28._0_2_;
      auVar28._12_2_ = auVar28._0_2_;
      auVar28._14_2_ = auVar28._0_2_;
      auVar28._16_2_ = auVar28._0_2_;
      auVar28._18_2_ = auVar28._0_2_;
      auVar28._20_2_ = auVar28._0_2_;
      auVar28._22_2_ = auVar28._0_2_;
      auVar28._24_2_ = auVar28._0_2_;
      auVar28._26_2_ = auVar28._0_2_;
      auVar28._28_2_ = auVar28._0_2_;
      auVar28._30_2_ = auVar28._0_2_;
      auVar15._8_2_ = 2;
      auVar15._0_8_ = 0x2000200020002;
      auVar15._10_2_ = 2;
      auVar15._12_2_ = 2;
      auVar15._14_2_ = 2;
      auVar15._16_2_ = 2;
      auVar15._18_2_ = 2;
      auVar15._20_2_ = 2;
      auVar15._22_2_ = 2;
      auVar15._24_2_ = 2;
      auVar15._26_2_ = 2;
      auVar15._28_2_ = 2;
      auVar15._30_2_ = 2;
      auVar16._8_2_ = 1;
      auVar16._0_8_ = 0x1000100010001;
      auVar16._10_2_ = 1;
      auVar16._12_2_ = 1;
      auVar16._14_2_ = 1;
      auVar16._16_2_ = 1;
      auVar16._18_2_ = 1;
      auVar16._20_2_ = 1;
      auVar16._22_2_ = 1;
      auVar16._24_2_ = 1;
      auVar16._26_2_ = 1;
      auVar16._28_2_ = 1;
      auVar16._30_2_ = 1;
      uVar10 = 0;
      auVar18._8_2_ = 8;
      auVar18._0_8_ = 0x8000800080008;
      auVar18._10_2_ = 8;
      auVar18._12_2_ = 8;
      auVar18._14_2_ = 8;
      auVar18._16_2_ = 8;
      auVar18._18_2_ = 8;
      auVar18._20_2_ = 8;
      auVar18._22_2_ = 8;
      auVar18._24_2_ = 8;
      auVar18._26_2_ = 8;
      auVar18._28_2_ = 8;
      auVar18._30_2_ = 8;
      do {
        auVar20._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])in +
             ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar20._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar3 * 2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar3 * 2));
        auVar24._16_16_ = auVar19;
        auVar24._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2 + 0x120));
        auVar35._16_16_ = auVar19;
        auVar35._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar8 * 2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar8 * 2));
        auVar48._16_16_ = auVar19;
        auVar48._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar8 * -2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar8 * -2 + 0x120));
        auVar62._16_16_ = auVar19;
        auVar62._0_16_ = auVar22;
        auVar17 = vpsubw_avx2(auVar24,auVar20);
        auVar26 = vpabsw_avx2(auVar17);
        auVar37 = vpsrlw_avx2(auVar26,ZEXT416(uVar5));
        auVar25 = vpsraw_avx2(auVar17,0xf);
        auVar37 = vpsubusw_avx2(auVar28,auVar37);
        auVar26 = vpminsw_avx2(auVar26,auVar37);
        auVar37 = vpaddw_avx2(auVar26,auVar25);
        auVar26 = vpsubw_avx2(auVar35,auVar20);
        auVar72 = vpsraw_avx2(auVar26,0xf);
        auVar26 = vpabsw_avx2(auVar26);
        auVar17 = vpsrlw_avx2(auVar26,ZEXT416(uVar5));
        auVar17 = vpsubusw_avx2(auVar28,auVar17);
        auVar26 = vpminsw_avx2(auVar17,auVar26);
        auVar26 = vpaddw_avx2(auVar72,auVar26);
        auVar37 = vpaddw_avx2(auVar72 ^ auVar26,auVar37 ^ auVar25);
        auVar26 = vpsubw_avx2(auVar48,auVar20);
        auVar49 = vpsraw_avx2(auVar26,0xf);
        auVar26 = vpabsw_avx2(auVar26);
        auVar14 = ZEXT416(uVar5);
        auVar17 = vpsrlw_avx2(auVar26,auVar14);
        auVar17 = vpsubusw_avx2(auVar28,auVar17);
        auVar26 = vpminsw_avx2(auVar17,auVar26);
        auVar17 = vpaddw_avx2(auVar49,auVar26);
        auVar72 = vpsubw_avx2(auVar62,auVar20);
        auVar26 = vpabsw_avx2(auVar72);
        auVar25 = vpsrlw_avx2(auVar26,auVar14);
        auVar72 = vpsraw_avx2(auVar72,0xf);
        auVar25 = vpsubusw_avx2(auVar28,auVar25);
        auVar26 = vpminsw_avx2(auVar26,auVar25);
        auVar26 = vpaddw_avx2(auVar26,auVar72);
        auVar26 = vpaddw_avx2(auVar26 ^ auVar72,auVar49 ^ auVar17);
        auVar26 = vpaddw_avx2(auVar37,auVar26);
        auVar25 = vpmullw_avx2(auVar26,auVar15);
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar4 * 2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar4 * 2));
        auVar36._16_16_ = auVar19;
        auVar36._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2 + 0x120));
        auVar50._16_16_ = auVar19;
        auVar50._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar11 * 2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar11 * 2));
        auVar63._16_16_ = auVar19;
        auVar63._0_16_ = auVar22;
        auVar19 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar11 * -2));
        auVar22 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar11 * -2 + 0x120));
        auVar73._16_16_ = auVar19;
        auVar73._0_16_ = auVar22;
        auVar17 = vpsubw_avx2(auVar36,auVar20);
        auVar26 = vpabsw_avx2(auVar17);
        auVar37 = vpsrlw_avx2(auVar26,auVar14);
        auVar72 = vpsraw_avx2(auVar17,0xf);
        auVar37 = vpsubusw_avx2(auVar28,auVar37);
        auVar26 = vpminsw_avx2(auVar26,auVar37);
        auVar37 = vpaddw_avx2(auVar26,auVar72);
        auVar26 = vpsubw_avx2(auVar50,auVar20);
        auVar49 = vpsraw_avx2(auVar26,0xf);
        auVar26 = vpabsw_avx2(auVar26);
        auVar17 = vpsrlw_avx2(auVar26,auVar14);
        auVar17 = vpsubusw_avx2(auVar28,auVar17);
        auVar26 = vpminsw_avx2(auVar26,auVar17);
        auVar26 = vpaddw_avx2(auVar26,auVar49);
        auVar37 = vpaddw_avx2(auVar26 ^ auVar49,auVar37 ^ auVar72);
        auVar26 = vpsubw_avx2(auVar63,auVar20);
        auVar64 = vpsraw_avx2(auVar26,0xf);
        auVar26 = vpabsw_avx2(auVar26);
        auVar17 = vpsrlw_avx2(auVar26,ZEXT416(uVar5));
        auVar17 = vpsubusw_avx2(auVar28,auVar17);
        auVar26 = vpminsw_avx2(auVar26,auVar17);
        auVar17 = vpaddw_avx2(auVar26,auVar64);
        auVar49 = vpsubw_avx2(auVar73,auVar20);
        auVar26 = vpabsw_avx2(auVar49);
        auVar72 = vpsrlw_avx2(auVar26,ZEXT416(uVar5));
        auVar49 = vpsraw_avx2(auVar49,0xf);
        auVar72 = vpsubusw_avx2(auVar28,auVar72);
        auVar26 = vpminsw_avx2(auVar26,auVar72);
        auVar26 = vpaddw_avx2(auVar26,auVar49);
        auVar26 = vpaddw_avx2(auVar17 ^ auVar64,auVar26 ^ auVar49);
        auVar26 = vpaddw_avx2(auVar26,auVar37);
        auVar26 = vpmullw_avx2(auVar26,auVar16);
        auVar26 = vpaddw_avx2(auVar26,auVar25);
        auVar37 = vpsraw_avx2(auVar26,0xf);
        auVar26 = vpaddw_avx2(auVar26,auVar18);
        auVar26 = vpaddw_avx2(auVar26,auVar37);
        auVar26 = vpsraw_avx2(auVar26,4);
        auVar26 = vpaddw_avx2(auVar26,auVar20);
        *(undefined1 (*) [16])dest = auVar26._16_16_;
        *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dest + (long)dstride * 2) =
             auVar26._0_16_;
        uVar10 = uVar10 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      } while (uVar10 < (uint)block_height);
    }
  }
  else {
    uVar5 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar5 = 0;
      }
    }
    if (0 < block_height) {
      auVar26._2_2_ = auVar28._0_2_;
      auVar26._0_2_ = auVar28._0_2_;
      auVar26._4_2_ = auVar28._0_2_;
      auVar26._6_2_ = auVar28._0_2_;
      auVar26._8_2_ = auVar28._0_2_;
      auVar26._10_2_ = auVar28._0_2_;
      auVar26._12_2_ = auVar28._0_2_;
      auVar26._14_2_ = auVar28._0_2_;
      auVar26._16_2_ = auVar28._0_2_;
      auVar26._18_2_ = auVar28._0_2_;
      auVar26._20_2_ = auVar28._0_2_;
      auVar26._22_2_ = auVar28._0_2_;
      auVar26._24_2_ = auVar28._0_2_;
      auVar26._26_2_ = auVar28._0_2_;
      auVar26._28_2_ = auVar28._0_2_;
      auVar26._30_2_ = auVar28._0_2_;
      auVar37._8_2_ = 2;
      auVar37._0_8_ = 0x2000200020002;
      auVar37._10_2_ = 2;
      auVar37._12_2_ = 2;
      auVar37._14_2_ = 2;
      auVar37._16_2_ = 2;
      auVar37._18_2_ = 2;
      auVar37._20_2_ = 2;
      auVar37._22_2_ = 2;
      auVar37._24_2_ = 2;
      auVar37._26_2_ = 2;
      auVar37._28_2_ = 2;
      auVar37._30_2_ = 2;
      auVar17._8_2_ = 1;
      auVar17._0_8_ = 0x1000100010001;
      auVar17._10_2_ = 1;
      auVar17._12_2_ = 1;
      auVar17._14_2_ = 1;
      auVar17._16_2_ = 1;
      auVar17._18_2_ = 1;
      auVar17._20_2_ = 1;
      auVar17._22_2_ = 1;
      auVar17._24_2_ = 1;
      auVar17._26_2_ = 1;
      auVar17._28_2_ = 1;
      auVar17._30_2_ = 1;
      lVar7 = (long)dstride;
      lVar9 = lVar11 * -2;
      lVar6 = lVar4 * -2;
      lVar12 = lVar8 * -2;
      lVar13 = lVar3 * -2;
      uVar10 = 0;
      auVar25._8_2_ = 8;
      auVar25._0_8_ = 0x8000800080008;
      auVar25._10_2_ = 8;
      auVar25._12_2_ = 8;
      auVar25._14_2_ = 8;
      auVar25._16_2_ = 8;
      auVar25._18_2_ = 8;
      auVar25._20_2_ = 8;
      auVar25._22_2_ = 8;
      auVar25._24_2_ = 8;
      auVar25._26_2_ = 8;
      auVar25._28_2_ = 8;
      auVar25._30_2_ = 8;
      do {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)in;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)((long)in + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar22,auVar19);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)((long)in + 0x240);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)((long)in + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar29,auVar14);
        auVar21._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar21._16_16_ = ZEXT116(1) * auVar19;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)((long)in + lVar3 * 2);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar30,auVar23);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x240);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar38,auVar31);
        auVar72._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar72._16_16_ = ZEXT116(1) * auVar19;
        auVar49 = vpsubw_avx2(auVar72,auVar21);
        auVar28 = vpabsw_avx2(auVar49);
        auVar72 = vpsrlw_avx2(auVar28,ZEXT416(uVar5));
        auVar27 = vpsraw_avx2(auVar49,0xf);
        auVar72 = vpsubusw_avx2(auVar26,auVar72);
        auVar28 = vpminsw_avx2(auVar72,auVar28);
        auVar72 = vpaddw_avx2(auVar28,auVar27);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)((long)in + lVar13);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)in + lVar13 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar39,auVar32);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)in + lVar13 + 0x240);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)((long)in + lVar13 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar52,auVar40);
        auVar49._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar49._16_16_ = ZEXT116(1) * auVar19;
        auVar64 = vpsubw_avx2(auVar49,auVar21);
        auVar28 = vpabsw_avx2(auVar64);
        auVar49 = vpsrlw_avx2(auVar28,ZEXT416(uVar5));
        auVar64 = vpsraw_avx2(auVar64,0xf);
        auVar49 = vpsubusw_avx2(auVar26,auVar49);
        auVar28 = vpminsw_avx2(auVar28,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar64);
        auVar72 = vpaddw_avx2(auVar28 ^ auVar64,auVar72 ^ auVar27);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)in + lVar8 * 2);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar41,auVar33);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x240);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar53,auVar42);
        auVar64._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar64._16_16_ = ZEXT116(1) * auVar19;
        auVar28 = vpsubw_avx2(auVar64,auVar21);
        auVar27 = vpsraw_avx2(auVar28,0xf);
        auVar28 = vpabsw_avx2(auVar28);
        auVar14 = ZEXT416(uVar5);
        auVar49 = vpsrlw_avx2(auVar28,auVar14);
        auVar49 = vpsubusw_avx2(auVar26,auVar49);
        auVar28 = vpminsw_avx2(auVar49,auVar28);
        auVar49 = vpaddw_avx2(auVar27,auVar28);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)in + lVar12);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)((long)in + lVar12 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar54,auVar43);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)((long)in + lVar12 + 0x240);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)((long)in + lVar12 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar67,auVar55);
        auVar65._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar65._16_16_ = ZEXT116(1) * auVar19;
        auVar28 = vpsubw_avx2(auVar65,auVar21);
        auVar65 = vpsraw_avx2(auVar28,0xf);
        auVar28 = vpabsw_avx2(auVar28);
        auVar64 = vpsrlw_avx2(auVar28,auVar14);
        auVar64 = vpsubusw_avx2(auVar26,auVar64);
        auVar28 = vpminsw_avx2(auVar28,auVar64);
        auVar28 = vpaddw_avx2(auVar28,auVar65);
        auVar28 = vpaddw_avx2(auVar28 ^ auVar65,auVar27 ^ auVar49);
        auVar28 = vpaddw_avx2(auVar72,auVar28);
        auVar64 = vpmullw_avx2(auVar28,auVar37);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)in + lVar4 * 2);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar44,auVar34);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x240);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar56,auVar45);
        auVar27._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar27._16_16_ = ZEXT116(1) * auVar19;
        auVar49 = vpsubw_avx2(auVar27,auVar21);
        auVar28 = vpabsw_avx2(auVar49);
        auVar72 = vpsrlw_avx2(auVar28,auVar14);
        auVar65 = vpsraw_avx2(auVar49,0xf);
        auVar72 = vpsubusw_avx2(auVar26,auVar72);
        auVar28 = vpminsw_avx2(auVar28,auVar72);
        auVar72 = vpaddw_avx2(auVar28,auVar65);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)in + lVar6);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)((long)in + lVar6 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar57,auVar46);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)((long)in + lVar6 + 0x240);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)((long)in + lVar6 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar68,auVar58);
        auVar74._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar74._16_16_ = ZEXT116(1) * auVar19;
        auVar27 = vpsubw_avx2(auVar74,auVar21);
        auVar28 = vpabsw_avx2(auVar27);
        auVar49 = vpsrlw_avx2(auVar28,auVar14);
        auVar27 = vpsraw_avx2(auVar27,0xf);
        auVar49 = vpsubusw_avx2(auVar26,auVar49);
        auVar28 = vpminsw_avx2(auVar28,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar27);
        auVar72 = vpaddw_avx2(auVar28 ^ auVar27,auVar72 ^ auVar65);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)((long)in + lVar11 * 2);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar59,auVar47);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x240);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)((long)in + lVar11 * 2 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar69,auVar60);
        auVar51._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar51._16_16_ = ZEXT116(1) * auVar19;
        auVar28 = vpsubw_avx2(auVar51,auVar21);
        auVar65 = vpsraw_avx2(auVar28,0xf);
        auVar28 = vpabsw_avx2(auVar28);
        auVar49 = vpsrlw_avx2(auVar28,ZEXT416(uVar5));
        auVar49 = vpsubusw_avx2(auVar26,auVar49);
        auVar28 = vpminsw_avx2(auVar28,auVar49);
        auVar49 = vpaddw_avx2(auVar28,auVar65);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)((long)in + lVar9);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)((long)in + lVar9 + 0x120);
        auVar19 = vpunpcklqdq_avx(auVar70,auVar61);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)((long)in + lVar9 + 0x240);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)((long)in + lVar9 + 0x360);
        auVar22 = vpunpcklqdq_avx(auVar75,auVar71);
        auVar66._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar22;
        auVar66._16_16_ = ZEXT116(1) * auVar19;
        auVar28 = vpsubw_avx2(auVar66,auVar21);
        auVar74 = vpsraw_avx2(auVar28,0xf);
        auVar28 = vpabsw_avx2(auVar28);
        auVar27 = vpsrlw_avx2(auVar28,ZEXT416(uVar5));
        auVar27 = vpsubusw_avx2(auVar26,auVar27);
        auVar28 = vpminsw_avx2(auVar28,auVar27);
        auVar28 = vpaddw_avx2(auVar28,auVar74);
        auVar28 = vpaddw_avx2(auVar49 ^ auVar65,auVar28 ^ auVar74);
        auVar28 = vpaddw_avx2(auVar28,auVar72);
        auVar28 = vpmullw_avx2(auVar28,auVar17);
        auVar28 = vpaddw_avx2(auVar28,auVar64);
        auVar72 = vpsraw_avx2(auVar28,0xf);
        auVar28 = vpaddw_avx2(auVar28,auVar25);
        auVar28 = vpaddw_avx2(auVar28,auVar72);
        auVar28 = vpsraw_avx2(auVar28,4);
        auVar28 = vpaddw_avx2(auVar28,auVar21);
        uVar1 = vpextrq_avx(auVar28._16_16_,1);
        *(undefined8 *)dest = uVar1;
        *(long *)((long)dest + lVar7 * 2) = auVar28._16_8_;
        uVar1 = vpextrq_avx(auVar28._0_16_,1);
        *(undefined8 *)((long)dest + lVar7 * 4) = uVar1;
        *(long *)((long)dest + lVar7 * 6) = auVar28._0_8_;
        uVar10 = uVar10 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + lVar7 * 8);
      } while (uVar10 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_2)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}